

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.cpp
# Opt level: O3

ScannerResult * __thiscall duckdb::BaseScanner::ParseChunk(BaseScanner *this)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ParseChunk() from CSV Base Scanner is not implemented","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ScannerResult &BaseScanner::ParseChunk() {
	throw InternalException("ParseChunk() from CSV Base Scanner is not implemented");
}